

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.cpp
# Opt level: O0

bool ParseHDKeypath(string *keypath_str,vector<unsigned_int,_std::allocator<unsigned_int>_> *keypath
                   )

{
  string_view str;
  undefined1 uVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  size_t pos;
  bool first;
  uint32_t number;
  uint32_t path;
  string item;
  stringstream ss;
  _Ios_Openmode in_stack_fffffffffffffda8;
  _Ios_Openmode in_stack_fffffffffffffdac;
  undefined6 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  __sv_type in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  char in_stack_fffffffffffffdff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  byte bVar6;
  bool local_1d9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1b0;
  stringstream local_190 [392];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3 = std::operator|(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8);
  std::__cxx11::stringstream::stringstream(local_190,(string *)in_RDI,_Var3);
  std::__cxx11::string::string(in_stack_fffffffffffffdc0);
  bVar6 = 1;
LAB_00356595:
  do {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_190,(string *)&local_1b0,'/');
    uVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&(this->_M_dataplus)._M_p +
                              *(long *)((this->_M_dataplus)._M_p + -0x18)));
    if (!(bool)uVar1) {
      local_1d9 = true;
LAB_003567d4:
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      std::__cxx11::stringstream::~stringstream(local_190);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_1d9;
      }
      __stack_chk_fail();
    }
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (in_RDI,(char *)this);
    if (iVar4 == 0) {
      if ((bVar6 & 1) == 0) {
        local_1d9 = false;
        goto LAB_003567d4;
      }
      bVar6 = 0;
      goto LAB_00356595;
    }
    __n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdff,
                     (size_type)in_stack_fffffffffffffde0._M_str);
    in_stack_fffffffffffffdf0 = __n;
    if (__n != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0xffffffffffffffff) {
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      if (__n != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar5 - 1)) {
        local_1d9 = false;
        goto LAB_003567d4;
      }
      in_stack_fffffffffffffdb8 = &local_1b0;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (this,CONCAT17(uVar1,in_stack_fffffffffffffdc8),(size_type)__n);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar6,in_stack_fffffffffffffe08),in_stack_fffffffffffffe00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      in_stack_fffffffffffffdc0 = __n;
    }
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_not_of(in_RDI,(char *)this,CONCAT17(uVar1,in_stack_fffffffffffffdc8));
    if (sVar5 != 0xffffffffffffffff) {
      local_1d9 = false;
      goto LAB_003567d4;
    }
    in_stack_fffffffffffffde0 =
         std::__cxx11::string::operator_cast_to_basic_string_view
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(uVar1,in_stack_fffffffffffffdc8));
    str._M_str._0_7_ = in_stack_fffffffffffffdc8;
    str._M_len = (size_t)in_stack_fffffffffffffdc0;
    str._M_str._7_1_ = uVar1;
    bVar2 = ParseUInt32(str,(uint32_t *)
                            CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    if (!bVar2) {
      local_1d9 = false;
      goto LAB_003567d4;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_fffffffffffffdb8,
               (value_type_conflict3 *)
               CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffdb6,in_stack_fffffffffffffdb0)));
    bVar6 = 0;
  } while( true );
}

Assistant:

bool ParseHDKeypath(const std::string& keypath_str, std::vector<uint32_t>& keypath)
{
    std::stringstream ss(keypath_str);
    std::string item;
    bool first = true;
    while (std::getline(ss, item, '/')) {
        if (item.compare("m") == 0) {
            if (first) {
                first = false;
                continue;
            }
            return false;
        }
        // Finds whether it is hardened
        uint32_t path = 0;
        size_t pos = item.find('\'');
        if (pos != std::string::npos) {
            // The hardened tick can only be in the last index of the string
            if (pos != item.size() - 1) {
                return false;
            }
            path |= 0x80000000;
            item = item.substr(0, item.size() - 1); // Drop the last character which is the hardened tick
        }

        // Ensure this is only numbers
        if (item.find_first_not_of( "0123456789" ) != std::string::npos) {
            return false;
        }
        uint32_t number;
        if (!ParseUInt32(item, &number)) {
            return false;
        }
        path |= number;

        keypath.push_back(path);
        first = false;
    }
    return true;
}